

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::UnaryExpression::propagateType(UnaryExpression *this,ASTContext *context,Type *newType)

{
  bool bVar1;
  logic_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->op - BitwiseAnd < 0xb) {
    bVar1 = false;
  }
  else {
    if (BitwiseNot < this->op) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                 ,"");
      plVar2 = (long *)std::__cxx11::string::append((char *)local_90);
      local_d0._M_dataplus._M_p = (pointer)*plVar2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
        local_d0.field_2._M_allocated_capacity = *psVar3;
        local_d0.field_2._8_8_ = plVar2[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar3;
      }
      local_d0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x1b5);
      std::operator+(&local_50,&local_d0,&local_70);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = (long *)*plVar2;
      plVar4 = plVar2 + 2;
      if (local_b0 == plVar4) {
        local_a0 = *plVar4;
        lStack_98 = plVar2[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar4;
      }
      local_a8 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_f0 = (long *)*plVar2;
      plVar4 = plVar2 + 2;
      if (local_f0 == plVar4) {
        local_e0 = *plVar4;
        lStack_d8 = plVar2[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar4;
      }
      local_e8 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    (this->super_Expression).type.ptr = newType;
    Expression::contextDetermined(context,&this->operand_,newType,(SourceLocation)0x0);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool UnaryExpression::propagateType(const ASTContext& context, const Type& newType) {
    switch (op) {
        case UnaryOperator::Plus:
        case UnaryOperator::Minus:
        case UnaryOperator::BitwiseNot:
            type = &newType;
            contextDetermined(context, operand_, newType);
            return true;
        case UnaryOperator::BitwiseAnd:
        case UnaryOperator::BitwiseOr:
        case UnaryOperator::BitwiseXor:
        case UnaryOperator::BitwiseNand:
        case UnaryOperator::BitwiseNor:
        case UnaryOperator::BitwiseXnor:
        case UnaryOperator::LogicalNot:
        case UnaryOperator::Preincrement:
        case UnaryOperator::Predecrement:
        case UnaryOperator::Postincrement:
        case UnaryOperator::Postdecrement:
            // Operand is self determined and already folded.
            return false;
    }
    ASSUME_UNREACHABLE;
}